

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O0

void __thiscall OpenMD::LangevinPiston::evolveEtaB(LangevinPiston *this)

{
  LangevinPiston *in_RDI;
  RealType *in_stack_ffffffffffffffe8;
  
  in_RDI->prevEta = in_RDI->eta;
  genRandomForce(in_RDI,in_stack_ffffffffffffffe8);
  in_RDI->eta = (in_RDI->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 *
                (-in_RDI->gamma_ * in_RDI->eta +
                 ((in_RDI->super_NPT).instaVol *
                 ((in_RDI->super_NPT).instaPress - (in_RDI->super_NPT).targetPressure)) /
                 (in_RDI->W_ * 163882576.0) + in_RDI->randomForce_ / in_RDI->W_) + in_RDI->oldEta;
  return;
}

Assistant:

void LangevinPiston::evolveEtaB() {
    prevEta = eta;

    genRandomForce(randomForce_);

    eta = oldEta + dt2 * (instaVol * (instaPress - targetPressure) /
                              (Constants::pressureConvert * W_) -
                          gamma_ * eta + randomForce_ / W_);
  }